

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

string * __thiscall
OperatorChar::toString_abi_cxx11_(string *__return_storage_ptr__,OperatorChar *this)

{
  size_type sVar1;
  long lStack_8;
  
  if (this->mIsTwoChars == true) {
    *(ushort *)&__return_storage_ptr__->field_2 = CONCAT11(this->mOp2,this->mOp1);
    sVar1 = 2;
    lStack_8 = 0x12;
  }
  else {
    (__return_storage_ptr__->field_2)._M_local_buf[0] = this->mOp1;
    sVar1 = 1;
    lStack_8 = 0x11;
  }
  *(undefined1 *)((long)&(__return_storage_ptr__->_M_dataplus)._M_p + lStack_8) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = sVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string OperatorChar::toString() const {
	if (mIsTwoChars) {
		return std::string({ mOp1, mOp2 });
	} else {
		return std::string({ mOp1 });
	}
}